

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_send_chunks(void)

{
  _Bool _Var1;
  cio_error cVar2;
  undefined4 local_9c;
  cio_error err;
  uint32_t context;
  cio_write_buffer wb;
  cio_write_buffer wbh;
  ws_frame frames [1];
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char check_data [12];
  char data [12];
  frame_direction direction;
  uint frame_type;
  uint k;
  frame_direction directions [2];
  
  _frame_type = 0x100000000;
  direction = FROM_CLIENT;
  while( true ) {
    if (FROM_SERVER < direction) {
      return;
    }
    wbh.data.element.length._4_4_ = (&frame_type)[direction];
    builtin_strncpy(check_data + 4,"HelloWor",8);
    frames[0]._28_1_ = 'H';
    frames[0]._29_1_ = 'e';
    frames[0]._30_1_ = 'l';
    frames[0]._31_1_ = 'l';
    cStack_30 = 'o';
    cStack_2f = 'W';
    cStack_2e = 'o';
    cStack_2d = 'r';
    builtin_strncpy(check_data,"ld!",4);
    wbh.data.element.length._0_4_ = 8;
    frames[0].frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME;
    frames[0].direction = FROM_CLIENT;
    frames[0].data = (void *)0x0;
    frames[0].data_length._0_1_ = 1;
    frames[0].data_length._1_1_ = 0;
    serialize_frames((ws_frame *)((long)&wbh.data + 8),1);
    cio_write_buffer_head_init((cio_write_buffer *)((long)&wb.data + 8));
    cio_write_buffer_element_init((cio_write_buffer *)&err,check_data + 4,6);
    cio_write_buffer_queue_tail((cio_write_buffer *)((long)&wb.data + 8),(cio_write_buffer *)&err);
    *(ushort *)&(ws->ws_private).ws_flags =
         *(ushort *)&(ws->ws_private).ws_flags & 0xfbff |
         (ushort)(wbh.data.element.length._4_4_ == 0) << 10;
    local_9c = 0x1234568;
    cVar2 = cio_websocket_write_message_first_chunk
                      (ws,0xc,(cio_write_buffer *)((long)&wb.data + 8),true,true,write_handler,
                       &local_9c);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Writing a frame did not succeed!",0xa4c,UNITY_DISPLAY_STYLE_INT);
    cio_write_buffer_head_init((cio_write_buffer *)((long)&wb.data + 8));
    cio_write_buffer_element_init((cio_write_buffer *)&err,check_data + 10,6);
    cio_write_buffer_queue_tail((cio_write_buffer *)((long)&wb.data + 8),(cio_write_buffer *)&err);
    cVar2 = cio_websocket_write_message_continuation_chunk
                      (ws,(cio_write_buffer *)((long)&wb.data + 8),write_handler,&local_9c);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Writing a frame did not succeed!",0xa52,UNITY_DISPLAY_STYLE_INT);
    _Var1 = check_frame(CIO_WEBSOCKET_BINARY_FRAME,&frames[0].field_0x1c,0xc,true);
    if (!_Var1) break;
    cVar2 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Could not start reading a message!",0xa57,UNITY_DISPLAY_STYLE_INT);
    _Var1 = is_close_frame(1000,true);
    if (!_Var1) {
      UnityFail("written frame is not a close frame!",0xa58);
    }
    UnityAssertEqualNumber
              (2,(ulong)write_handler_fake.call_count,"write handler was not called!",0xa5a,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_val,
               "websocket pointer in write handler not correct!",0xa5b,UNITY_DISPLAY_STYLE_HEX64);
    UnityAssertEqualNumber
              ((UNITY_INT)&local_9c,(UNITY_INT)write_handler_fake.arg1_val,
               "context pointer in write handler not correct!",0xa5c,UNITY_DISPLAY_STYLE_HEX64);
    UnityAssertEqualNumber
              (0,(long)write_handler_fake.arg2_val,"error code in write handler not correct!",0xa5d,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_error_fake.call_count,"error callback was called",0xa5f,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_control_fake.call_count,
               "control callback was called not for last close frame",0xa60,UNITY_DISPLAY_STYLE_INT)
    ;
    free(ws);
    setUp();
    direction = direction + FROM_SERVER;
  }
  UnityFail("First frame send is incorrect text frame!",0xa54);
}

Assistant:

static void test_send_chunks(void)
{
	enum frame_direction directions[] = {FROM_CLIENT, FROM_SERVER};

	for (unsigned int k = 0; k < ARRAY_SIZE(directions); k++) {
		unsigned int frame_type = CIO_WEBSOCKET_BINARY_FRAME;
		enum frame_direction direction = directions[k];
		char data[] = "HelloWorld!";
		char check_data[] = "HelloWorld!";

		struct ws_frame frames[] = {
		    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = direction, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
		};

		serialize_frames(frames, ARRAY_SIZE(frames));

		struct cio_write_buffer wbh;
		cio_write_buffer_head_init(&wbh);

		struct cio_write_buffer wb;
		cio_write_buffer_element_init(&wb, data, sizeof(data) / 2);
		cio_write_buffer_queue_tail(&wbh, &wb);

		ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
		uint32_t context = 0x1234568;
		enum cio_error err = cio_websocket_write_message_first_chunk(ws, sizeof(data), &wbh, true, frame_type == CIO_WEBSOCKET_BINARY_FRAME, write_handler, &context);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a frame did not succeed!");

		cio_write_buffer_head_init(&wbh);
		cio_write_buffer_element_init(&wb, &data[sizeof(data) / 2], sizeof(data) - (sizeof(data) / 2));
		cio_write_buffer_queue_tail(&wbh, &wb);
		err = cio_websocket_write_message_continuation_chunk(ws, &wbh, write_handler, &context);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a frame did not succeed!");

		TEST_ASSERT_MESSAGE(check_frame(frame_type, check_data, sizeof(check_data), true), "First frame send is incorrect text frame!");

		err = cio_websocket_read_message(ws, read_handler, NULL);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");
		TEST_ASSERT_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_NORMAL, true), "written frame is not a close frame!");

		TEST_ASSERT_EQUAL_MESSAGE(2, write_handler_fake.call_count, "write handler was not called!");
		TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, write_handler_fake.arg0_val, "websocket pointer in write handler not correct!");
		TEST_ASSERT_EQUAL_PTR_MESSAGE(&context, write_handler_fake.arg1_val, "context pointer in write handler not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_val, "error code in write handler not correct!");

		TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");
		TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was called not for last close frame");

		free(ws);
		setUp();
	}
}